

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# php_generator.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::php::Generator::GenerateAll
          (Generator *this,
          vector<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
          *files,string *parameter,GeneratorContext *generator_context,string *error)

{
  ulong uVar1;
  protobuf *ppVar2;
  char *pcVar3;
  Options *pOVar4;
  _anonymous_namespace_ *p_Var5;
  pointer ppFVar6;
  size_type __val;
  pointer pbVar7;
  char cVar8;
  bool bVar9;
  int iVar10;
  pointer pbVar11;
  LogMessage *pLVar12;
  ZeroCopyOutputStream *pZVar13;
  FileDescriptor *pFVar14;
  Options *options_00;
  size_type sVar15;
  Options *pOVar16;
  char cVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  string *result_00;
  pointer ppFVar18;
  ulong uVar19;
  long lVar20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar21;
  pointer ppFVar22;
  ulong uVar23;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  StringPiece full;
  StringPiece full_00;
  StringPiece full_01;
  string serialized;
  string __str;
  string metadata_classname;
  string metadata_c_name;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  option_pair;
  string c_name;
  string metadata_filename;
  FileDescriptorProto file_proto;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  result;
  string local_130;
  Options options;
  Printer printer;
  undefined4 extraout_var;
  
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header;
  options.is_descriptor = false;
  options.aggregate_metadata = false;
  options.gen_c_wkt = false;
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red
  ;
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  ppVar2 = (protobuf *)(parameter->_M_dataplus)._M_p;
  pcVar3 = (char *)parameter->_M_string_length;
  result_00 = error;
  options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       options.aggregate_metadata_prefixes._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if ((long)pcVar3 < 0) {
    stringpiece_internal::StringPiece::LogFatalSizeTooBig
              ((size_t)pcVar3,"string length exceeds max size");
  }
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  result.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  full.length_ = (size_type)",";
  full.ptr_ = pcVar3;
  SplitStringUsing(ppVar2,full,(char *)&result,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)result_00);
  pbVar7 = result.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      result.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar11 = result.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      ppVar2 = (protobuf *)(pbVar11->_M_dataplus)._M_p;
      pcVar3 = (char *)pbVar11->_M_string_length;
      if ((long)pcVar3 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  ((size_t)pcVar3,"string length exceeds max size");
      }
      option_pair.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      option_pair.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      option_pair.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      full_00.length_ = (size_type)"=";
      full_00.ptr_ = pcVar3;
      SplitStringUsing(ppVar2,full_00,(char *)&option_pair,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)result_00);
      pcVar3 = ((option_pair.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p;
      uVar19 = (option_pair.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
      if ((long)uVar19 < 0) {
        stringpiece_internal::StringPiece::LogFatalSizeTooBig
                  (uVar19,"string length exceeds max size");
LAB_002753f6:
        auVar25[0] = -(*pcVar3 == 'a');
        auVar25[1] = -(pcVar3[1] == 'g');
        auVar25[2] = -(pcVar3[2] == 'g');
        auVar25[3] = -(pcVar3[3] == 'r');
        auVar25[4] = -(pcVar3[4] == 'e');
        auVar25[5] = -(pcVar3[5] == 'g');
        auVar25[6] = -(pcVar3[6] == 'a');
        auVar25[7] = -(pcVar3[7] == 't');
        auVar25[8] = -(pcVar3[8] == 'e');
        auVar25[9] = -(pcVar3[9] == '_');
        auVar25[10] = -(pcVar3[10] == 'm');
        auVar25[0xb] = -(pcVar3[0xb] == 'e');
        auVar25[0xc] = -(pcVar3[0xc] == 't');
        auVar25[0xd] = -(pcVar3[0xd] == 'a');
        auVar25[0xe] = -(pcVar3[0xe] == 'd');
        auVar25[0xf] = -(pcVar3[0xf] == 'a');
        auVar26[0] = -((char)*(undefined2 *)(pcVar3 + 0x10) == 't');
        auVar26[1] = -((char)((ushort)*(undefined2 *)(pcVar3 + 0x10) >> 8) == 'a');
        auVar26[2] = 0xff;
        auVar26[3] = 0xff;
        auVar26[4] = 0xff;
        auVar26[5] = 0xff;
        auVar26[6] = 0xff;
        auVar26[7] = 0xff;
        auVar26[8] = 0xff;
        auVar26[9] = 0xff;
        auVar26[10] = 0xff;
        auVar26[0xb] = 0xff;
        auVar26[0xc] = 0xff;
        auVar26[0xd] = 0xff;
        auVar26[0xe] = 0xff;
        auVar26[0xf] = 0xff;
        auVar26 = auVar26 & auVar25;
        if ((ushort)((ushort)(SUB161(auVar26 >> 7,0) & 1) |
                     (ushort)(SUB161(auVar26 >> 0xf,0) & 1) << 1 |
                     (ushort)(SUB161(auVar26 >> 0x17,0) & 1) << 2 |
                     (ushort)(SUB161(auVar26 >> 0x1f,0) & 1) << 3 |
                     (ushort)(SUB161(auVar26 >> 0x27,0) & 1) << 4 |
                     (ushort)(SUB161(auVar26 >> 0x2f,0) & 1) << 5 |
                     (ushort)(SUB161(auVar26 >> 0x37,0) & 1) << 6 |
                     (ushort)(SUB161(auVar26 >> 0x3f,0) & 1) << 7 |
                     (ushort)(SUB161(auVar26 >> 0x47,0) & 1) << 8 |
                     (ushort)(SUB161(auVar26 >> 0x4f,0) & 1) << 9 |
                     (ushort)(SUB161(auVar26 >> 0x57,0) & 1) << 10 |
                     (ushort)(SUB161(auVar26 >> 0x5f,0) & 1) << 0xb |
                     (ushort)(SUB161(auVar26 >> 0x67,0) & 1) << 0xc |
                     (ushort)(SUB161(auVar26 >> 0x6f,0) & 1) << 0xd |
                     (ushort)(SUB161(auVar26 >> 0x77,0) & 1) << 0xe |
                    (ushort)(byte)(auVar26[0xf] >> 7) << 0xf) != 0xffff) goto LAB_0027542f;
        options.aggregate_metadata = true;
        ppVar2 = (protobuf *)
                 option_pair.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[1]._M_dataplus._M_p;
        pcVar3 = (char *)option_pair.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[1]._M_string_length;
        if ((long)pcVar3 < 0) {
          stringpiece_internal::StringPiece::LogFatalSizeTooBig
                    ((size_t)pcVar3,"string length exceeds max size");
        }
        printer.variable_delimiter_ = '\0';
        printer._1_7_ = 0;
        printer.output_ = (ZeroCopyOutputStream *)0x0;
        printer.buffer_ = (char *)0x0;
        full_01.length_ = (size_type)"#";
        full_01.ptr_ = pcVar3;
        SplitStringAllowEmpty
                  (ppVar2,full_01,&printer.variable_delimiter_,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)result_00);
        pZVar13 = printer.output_;
        for (pbVar21 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       printer._0_8_;
            pbVar21 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pZVar13;
            pbVar21 = pbVar21 + 1) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_emplace_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)&options.aggregate_metadata_prefixes,pbVar21);
          internal::LogMessage::LogMessage
                    ((LogMessage *)&file_proto,LOGLEVEL_INFO,
                     "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/php/php_generator.cc"
                     ,0x8fe);
          pLVar12 = internal::LogMessage::operator<<((LogMessage *)&file_proto,pbVar21);
          internal::LogFinisher::operator=((LogFinisher *)&c_name,pLVar12);
          internal::LogMessage::~LogMessage((LogMessage *)&file_proto);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&printer);
      }
      else {
        if (0x11 < uVar19) goto LAB_002753f6;
LAB_0027542f:
        iVar10 = std::__cxx11::string::compare
                           ((char *)option_pair.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start);
        if (iVar10 == 0) {
          options.is_descriptor = true;
        }
        else {
          iVar10 = std::__cxx11::string::compare
                             ((char *)option_pair.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start);
          if (iVar10 == 0) {
            file_proto.super_Message.super_MessageLite._vptr_MessageLite =
                 (_func_int **)&file_proto._has_bits_;
            printer._0_8_ = 0x1e;
            file_proto.super_Message.super_MessageLite._vptr_MessageLite =
                 (_func_int **)std::__cxx11::string::_M_create((ulong *)&file_proto,(ulong)&printer)
            ;
            file_proto._16_8_ = printer._0_8_;
            builtin_strncpy((char *)((long)file_proto.super_Message.super_MessageLite.
                                           _vptr_MessageLite + 0xe),"protobuf",8);
            builtin_strncpy((char *)((long)file_proto.super_Message.super_MessageLite.
                                           _vptr_MessageLite + 0x16),"/wkt.inc",8);
            *file_proto.super_Message.super_MessageLite._vptr_MessageLite =
                 (_func_int *)0x672f7478652f2e2e;
            file_proto.super_Message.super_MessageLite._vptr_MessageLite[1] =
                 (_func_int *)0x72702f656c676f6f;
            file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = printer._0_8_;
            *(char *)((long)file_proto.super_Message.super_MessageLite._vptr_MessageLite +
                     printer._0_8_) = '\0';
            iVar10 = (*generator_context->_vptr_GeneratorContext[2])(generator_context,&file_proto);
            pZVar13 = (ZeroCopyOutputStream *)CONCAT44(extraout_var,iVar10);
            if ((HasBits<1UL> *)file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
                &file_proto._has_bits_) {
              operator_delete(file_proto.super_Message.super_MessageLite._vptr_MessageLite);
            }
            io::Printer::Printer(&printer,pZVar13,'$');
            io::Printer::Print<>
                      (&printer,
                       "// This file is generated from the .proto files for the well-known\n// types. Do not edit!\n\n"
                      );
            io::Printer::Print<>
                      (&printer,
                       "ZEND_BEGIN_ARG_INFO_EX(arginfo_lookup, 0, 0, 1)\n  ZEND_ARG_INFO(0, key)\nZEND_END_ARG_INFO()\n\n"
                      );
            ppFVar18 = (files->
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       )._M_impl.super__Vector_impl_data._M_start;
            ppFVar6 = (files->
                      super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish;
            if (ppFVar18 != ppFVar6) {
              do {
                (anonymous_namespace)::FilenameCName_abi_cxx11_
                          ((string *)&file_proto,(_anonymous_namespace_ *)**(undefined8 **)*ppFVar18
                           ,(FileDescriptor *)(*(undefined8 **)*ppFVar18)[1]);
                io::Printer::Print<char[7],std::__cxx11::string>
                          (&printer,"static void $c_name$_AddDescriptor();\n",(char (*) [7])0x3e9007
                           ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &file_proto);
                if ((HasBits<1UL> *)file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
                    &file_proto._has_bits_) {
                  operator_delete(file_proto.super_Message.super_MessageLite._vptr_MessageLite);
                }
                ppFVar18 = ppFVar18 + 1;
              } while (ppFVar18 != ppFVar6);
              pOVar4 = (Options *)
                       (files->
                       super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
              for (pOVar16 = (Options *)
                             (files->
                             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                             )._M_impl.super__Vector_impl_data._M_start; pOVar16 != pOVar4;
                  pOVar16 = (Options *)&pOVar16->aggregate_metadata_prefixes) {
                p_Var5 = *(_anonymous_namespace_ **)pOVar16;
                options_00 = pOVar16;
                (anonymous_namespace)::FilenameCName_abi_cxx11_
                          (&c_name,(_anonymous_namespace_ *)**(undefined8 **)p_Var5,
                           (FileDescriptor *)(*(undefined8 **)p_Var5)[1]);
                file_proto._has_bits_.has_bits_[0] = (uint32_t  [1])0x0;
                file_proto._cached_size_.size_.super___atomic_base<int>._M_i = (atomic<int>)0x0;
                file_proto.dependency_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
                file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
                file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
                file_proto.dependency_.super_RepeatedPtrFieldBase._8_8_ = &file_proto._has_bits_;
                file_proto.message_type_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
                file_proto.dependency_.super_RepeatedPtrFieldBase.rep_ =
                     (Rep *)file_proto.dependency_.super_RepeatedPtrFieldBase._8_8_;
                (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
                          (&metadata_filename,p_Var5,(FileDescriptor *)&file_proto,options_00);
                std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)&file_proto.super_Message.super_MessageLite._internal_metadata_);
                anon_unknown_2::FilenameToClassname(&metadata_classname,&metadata_filename);
                file_proto._has_bits_.has_bits_[0]._0_2_ = 0x5c;
                file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = 1;
                file_proto.super_Message.super_MessageLite._vptr_MessageLite =
                     (_func_int **)&file_proto._has_bits_;
                serialized.field_2._M_allocated_capacity._0_2_ = 0x5f;
                serialized._M_string_length = 1;
                serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
                StringReplace(&metadata_c_name,&metadata_classname,(string *)&file_proto,&serialized
                              ,true);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)serialized._M_dataplus._M_p != &serialized.field_2) {
                  operator_delete(serialized._M_dataplus._M_p);
                }
                if ((HasBits<1UL> *)file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
                    &file_proto._has_bits_) {
                  operator_delete(file_proto.super_Message.super_MessageLite._vptr_MessageLite);
                }
                serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
                serialized.field_2._M_allocated_capacity._0_2_ = 0x5c;
                serialized._M_string_length = 1;
                __str._M_dataplus._M_p = (pointer)&__str.field_2;
                __str.field_2._M_allocated_capacity._0_2_ = 0x5c5c;
                __str._M_string_length = 2;
                __str.field_2._M_local_buf[2] = '\0';
                StringReplace((string *)&file_proto,&metadata_classname,&serialized,&__str,true);
                std::__cxx11::string::operator=((string *)&metadata_classname,(string *)&file_proto)
                ;
                if ((HasBits<1UL> *)file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
                    &file_proto._has_bits_) {
                  operator_delete(file_proto.super_Message.super_MessageLite._vptr_MessageLite);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p != &__str.field_2) {
                  operator_delete(__str._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)serialized._M_dataplus._M_p != &serialized.field_2) {
                  operator_delete(serialized._M_dataplus._M_p);
                }
                FileDescriptorProto::FileDescriptorProto(&file_proto,(Arena *)0x0,false);
                FileDescriptor::CopyTo((FileDescriptor *)p_Var5,&file_proto);
                serialized._M_dataplus._M_p = (pointer)&serialized.field_2;
                serialized._M_string_length = 0;
                serialized.field_2._M_allocated_capacity._0_2_ =
                     serialized.field_2._M_allocated_capacity._0_2_ & 0xff00;
                MessageLite::SerializeToString((MessageLite *)&file_proto,&serialized);
                __val = serialized._M_string_length;
                cVar17 = '\x01';
                if (9 < serialized._M_string_length) {
                  sVar15 = serialized._M_string_length;
                  cVar8 = '\x04';
                  do {
                    cVar17 = cVar8;
                    if (sVar15 < 100) {
                      cVar17 = cVar17 + -2;
                      goto LAB_00275873;
                    }
                    if (sVar15 < 1000) {
                      cVar17 = cVar17 + -1;
                      goto LAB_00275873;
                    }
                    if (sVar15 < 10000) goto LAB_00275873;
                    bVar9 = 99999 < sVar15;
                    sVar15 = sVar15 / 10000;
                    cVar8 = cVar17 + '\x04';
                  } while (bVar9);
                  cVar17 = cVar17 + '\x01';
                }
LAB_00275873:
                pbVar21 = *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                           p_Var5;
                __str._M_dataplus._M_p = (pointer)&__str.field_2;
                std::__cxx11::string::_M_construct((ulong)&__str,cVar17);
                std::__detail::__to_chars_10_impl<unsigned_long>
                          (__str._M_dataplus._M_p,(uint)__str._M_string_length,__val);
                io::Printer::
                Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[16],std::__cxx11::string,char[5],std::__cxx11::string>
                          (&printer,
                           "/* $filename$ */\n\nzend_class_entry* $metadata_c_name$_ce;\n\nconst char $c_name$_descriptor [$size$] = {\n"
                           ,(char (*) [9])"filename",pbVar21,(char (*) [7])0x3e9007,&c_name,
                           (char (*) [16])"metadata_c_name",&metadata_c_name,(char (*) [5])0x3d7353,
                           &__str);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)__str._M_dataplus._M_p != &__str.field_2) {
                  operator_delete(__str._M_dataplus._M_p);
                }
                for (uVar19 = 0; uVar19 < serialized._M_string_length; uVar19 = uVar19 + uVar1) {
                  uVar23 = 0;
                  do {
                    std::__cxx11::string::substr((ulong)&local_130,(ulong)&serialized);
                    CEscape(&__str,&local_130);
                    io::Printer::Print<char[3],std::__cxx11::string>
                              (&printer,"\'$ch$\', ",(char (*) [3])0x43d316,&__str);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)__str._M_dataplus._M_p != &__str.field_2) {
                      operator_delete(__str._M_dataplus._M_p);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_130._M_dataplus._M_p != &local_130.field_2) {
                      operator_delete(local_130._M_dataplus._M_p);
                    }
                    uVar1 = uVar23 + 1;
                  } while ((uVar23 < 0x18) &&
                          (lVar20 = uVar23 + uVar19, uVar23 = uVar1,
                          lVar20 + 1U < serialized._M_string_length));
                  io::Printer::Print<>(&printer,"\n");
                }
                io::Printer::
                Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[16],std::__cxx11::string>
                          (&printer,
                           "};\n\nstatic void $c_name$_AddDescriptor() {\n  if (DescriptorPool_HasFile(\"$filename$\")) return;\n"
                           ,(char (*) [9])"filename",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            p_Var5,(char (*) [7])0x3e9007,&c_name,(char (*) [16])"metadata_c_name",
                           &metadata_c_name);
                if (0 < *(int *)(p_Var5 + 0x20)) {
                  iVar10 = 0;
                  do {
                    pFVar14 = FileDescriptor::dependency((FileDescriptor *)p_Var5,iVar10);
                    (anonymous_namespace)::FilenameCName_abi_cxx11_
                              (&__str,(_anonymous_namespace_ *)**(undefined8 **)pFVar14,
                               (FileDescriptor *)(*(undefined8 **)pFVar14)[1]);
                    io::Printer::Print<char[11],std::__cxx11::string>
                              (&printer,"  $dep_c_name$_AddDescriptor();\n",
                               (char (*) [11])"dep_c_name",&__str);
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)__str._M_dataplus._M_p != &__str.field_2) {
                      operator_delete(__str._M_dataplus._M_p);
                    }
                    iVar10 = iVar10 + 1;
                  } while (iVar10 < *(int *)(p_Var5 + 0x20));
                }
                result_00 = (string *)0x3e9007;
                io::Printer::
                Print<char[9],std::__cxx11::string,char[7],std::__cxx11::string,char[16],std::__cxx11::string,char[19],std::__cxx11::string>
                          (&printer,
                           "  DescriptorPool_AddDescriptor(\"$filename$\", $c_name$_descriptor,\n                               sizeof($c_name$_descriptor));\n}\n\nstatic PHP_METHOD($metadata_c_name$, initOnce) {\n  $c_name$_AddDescriptor();\n}\n\nstatic zend_function_entry $metadata_c_name$_methods[] = {\n  PHP_ME($metadata_c_name$, initOnce, arginfo_void, ZEND_ACC_PUBLIC | ZEND_ACC_STATIC)\n  ZEND_FE_END\n};\n\nstatic void $metadata_c_name$_ModuleInit() {\n  zend_class_entry tmp_ce;\n\n  INIT_CLASS_ENTRY(tmp_ce, \"$metadata_classname$\",\n                   $metadata_c_name$_methods);\n\n  $metadata_c_name$_ce = zend_register_internal_class(&tmp_ce);\n}\n\n"
                           ,(char (*) [9])"filename",
                           *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
                            p_Var5,(char (*) [7])0x3e9007,&c_name,(char (*) [16])"metadata_c_name",
                           &metadata_c_name,(char (*) [19])"metadata_classname",&metadata_classname)
                ;
                if (0 < *(int *)(p_Var5 + 0x2c)) {
                  lVar20 = 0;
                  lVar24 = 0;
                  do {
                    anon_unknown_2::GenerateCMessage
                              ((Descriptor *)(*(long *)(p_Var5 + 0x58) + lVar20),&printer);
                    lVar24 = lVar24 + 1;
                    lVar20 = lVar20 + 0x88;
                  } while (lVar24 < *(int *)(p_Var5 + 0x2c));
                }
                if (0 < *(int *)(p_Var5 + 0x30)) {
                  lVar20 = 0;
                  lVar24 = 0;
                  do {
                    anon_unknown_2::GenerateCEnum
                              ((EnumDescriptor *)(*(long *)(p_Var5 + 0x60) + lVar20),&printer);
                    lVar24 = lVar24 + 1;
                    lVar20 = lVar20 + 0x48;
                  } while (lVar24 < *(int *)(p_Var5 + 0x30));
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)serialized._M_dataplus._M_p != &serialized.field_2) {
                  operator_delete(serialized._M_dataplus._M_p);
                }
                FileDescriptorProto::~FileDescriptorProto(&file_proto);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)metadata_c_name._M_dataplus._M_p != &metadata_c_name.field_2) {
                  operator_delete(metadata_c_name._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)metadata_classname._M_dataplus._M_p != &metadata_classname.field_2) {
                  operator_delete(metadata_classname._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)metadata_filename._M_dataplus._M_p != &metadata_filename.field_2) {
                  operator_delete(metadata_filename._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)c_name._M_dataplus._M_p != &c_name.field_2) {
                  operator_delete(c_name._M_dataplus._M_p);
                }
              }
            }
            io::Printer::Print<>(&printer,"static void WellKnownTypes_ModuleInit() {\n");
            pOVar4 = (Options *)
                     (files->
                     super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                     )._M_impl.super__Vector_impl_data._M_finish;
            for (pOVar16 = (Options *)
                           (files->
                           super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
                           )._M_impl.super__Vector_impl_data._M_start; pOVar16 != pOVar4;
                pOVar16 = (Options *)&pOVar16->aggregate_metadata_prefixes) {
              p_Var5 = *(_anonymous_namespace_ **)pOVar16;
              file_proto._has_bits_.has_bits_[0] = (uint32_t  [1])0x0;
              file_proto._cached_size_.size_.super___atomic_base<int>._M_i = (atomic<int>)0x0;
              file_proto.dependency_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
              file_proto.super_Message.super_MessageLite._vptr_MessageLite = (_func_int **)0x0;
              file_proto.super_Message.super_MessageLite._internal_metadata_.ptr_ = 0;
              file_proto.dependency_.super_RepeatedPtrFieldBase._8_8_ = &file_proto._has_bits_;
              file_proto.message_type_.super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
              file_proto.dependency_.super_RepeatedPtrFieldBase.rep_ =
                   (Rep *)file_proto.dependency_.super_RepeatedPtrFieldBase._8_8_;
              (anonymous_namespace)::GeneratedMetadataFileName_abi_cxx11_
                        (&c_name,p_Var5,(FileDescriptor *)&file_proto,pOVar16);
              std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)&file_proto.super_Message.super_MessageLite._internal_metadata_);
              anon_unknown_2::FilenameToClassname((string *)&file_proto,&c_name);
              metadata_classname._M_dataplus._M_p = (pointer)&metadata_classname.field_2;
              metadata_classname.field_2._M_allocated_capacity._0_2_ = 0x5c;
              metadata_classname._M_string_length = 1;
              metadata_c_name.field_2._M_allocated_capacity._0_2_ = 0x5f;
              metadata_c_name._M_string_length = 1;
              result_00 = (string *)0x1;
              metadata_c_name._M_dataplus._M_p = (pointer)&metadata_c_name.field_2;
              StringReplace(&metadata_filename,(string *)&file_proto,&metadata_classname,
                            &metadata_c_name,true);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)metadata_c_name._M_dataplus._M_p != &metadata_c_name.field_2) {
                operator_delete(metadata_c_name._M_dataplus._M_p);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)metadata_classname._M_dataplus._M_p != &metadata_classname.field_2) {
                operator_delete(metadata_classname._M_dataplus._M_p);
              }
              io::Printer::Print<char[16],std::__cxx11::string>
                        (&printer,"  $metadata_c_name$_ModuleInit();\n",
                         (char (*) [16])"metadata_c_name",&metadata_filename);
              if (0 < *(int *)(p_Var5 + 0x2c)) {
                lVar24 = 0;
                lVar20 = 0;
                do {
                  anon_unknown_2::GenerateCInit
                            ((Descriptor *)(*(long *)(p_Var5 + 0x58) + lVar24),&printer);
                  lVar20 = lVar20 + 1;
                  lVar24 = lVar24 + 0x88;
                } while (lVar20 < *(int *)(p_Var5 + 0x2c));
              }
              if (0 < *(int *)(p_Var5 + 0x30)) {
                lVar24 = 8;
                lVar20 = 0;
                do {
                  anon_unknown_2::GenerateEnumCInit
                            (*(anon_unknown_2 **)
                              (*(long *)(*(long *)(p_Var5 + 0x60) + lVar24) + 0x20),
                             *(EnumDescriptor **)
                              (*(long *)(*(long *)(p_Var5 + 0x60) + lVar24) + 0x28),&printer);
                  lVar20 = lVar20 + 1;
                  lVar24 = lVar24 + 0x48;
                } while (lVar20 < *(int *)(p_Var5 + 0x30));
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)metadata_filename._M_dataplus._M_p != &metadata_filename.field_2) {
                operator_delete(metadata_filename._M_dataplus._M_p);
              }
              if ((HasBits<1UL> *)file_proto.super_Message.super_MessageLite._vptr_MessageLite !=
                  &file_proto._has_bits_) {
                operator_delete(file_proto.super_Message.super_MessageLite._vptr_MessageLite);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)c_name._M_dataplus._M_p != &c_name.field_2) {
                operator_delete(c_name._M_dataplus._M_p);
              }
            }
            io::Printer::Print<>(&printer,"}\n");
            io::Printer::~Printer(&printer);
            if (pZVar13 != (ZeroCopyOutputStream *)0x0) {
              (*pZVar13->_vptr_ZeroCopyOutputStream[1])();
            }
          }
          else {
            internal::LogMessage::LogMessage
                      ((LogMessage *)&file_proto,LOGLEVEL_DFATAL,
                       "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/php/php_generator.cc"
                       ,0x905);
            pLVar12 = internal::LogMessage::operator<<
                                ((LogMessage *)&file_proto,"Unknown codegen option: ");
            pLVar12 = internal::LogMessage::operator<<
                                (pLVar12,option_pair.
                                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start);
            internal::LogFinisher::operator=((LogFinisher *)&printer,pLVar12);
            internal::LogMessage::~LogMessage((LogMessage *)&file_proto);
          }
        }
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&option_pair);
      pbVar11 = pbVar11 + 1;
    } while (pbVar11 != pbVar7);
  }
  this_00 = &result;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(this_00);
  ppFVar18 = (files->
             super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
             )._M_impl.super__Vector_impl_data._M_start;
  ppFVar6 = (files->
            super__Vector_base<const_google::protobuf::FileDescriptor_*,_std::allocator<const_google::protobuf::FileDescriptor_*>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  if (ppFVar18 == ppFVar6) {
    bVar9 = true;
  }
  else {
    do {
      ppFVar22 = ppFVar18 + 1;
      bVar9 = Generate((Generator *)this_00,*ppFVar18,&options,generator_context,error);
      ppFVar18 = ppFVar22;
    } while (bVar9 && ppFVar22 != ppFVar6);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&options.aggregate_metadata_prefixes._M_t);
  return bVar9;
}

Assistant:

bool Generator::GenerateAll(const std::vector<const FileDescriptor*>& files,
                            const std::string& parameter,
                            GeneratorContext* generator_context,
                            std::string* error) const {
  Options options;

  for (const auto& option : Split(parameter, ",", true)) {
    const std::vector<std::string> option_pair = Split(option, "=", true);
    if (HasPrefixString(option_pair[0], "aggregate_metadata")) {
      options.aggregate_metadata = true;
      for (const auto& prefix : Split(option_pair[1], "#", false)) {
        options.aggregate_metadata_prefixes.emplace(prefix);
        GOOGLE_LOG(INFO) << prefix;
      }
    } else if (option_pair[0] == "internal") {
      options.is_descriptor = true;
    } else if (option_pair[0] == "internal_generate_c_wkt") {
      GenerateCWellKnownTypes(files, generator_context);
    } else {
      GOOGLE_LOG(FATAL) << "Unknown codegen option: " << option_pair[0];
    }
  }

  for (auto file : files) {
    if (!Generate(file, options, generator_context, error)) {
      return false;
    }
  }

  return true;
}